

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O0

void __thiscall
UtilizationWidget::UtilizationWidget(UtilizationWidget *this,UtilizationContainer *container)

{
  int iVar1;
  undefined1 local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  UtilizationContainer *local_18;
  UtilizationContainer *container_local;
  UtilizationWidget *this_local;
  
  local_18 = container;
  container_local = (UtilizationContainer *)this;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00141350;
  *(undefined ***)&this->field_0x10 = &PTR__UtilizationWidget_00141508;
  QVarLengthArray<UtilizationData,_256LL>::QVarLengthArray(&this->utilizationData);
  QVarLengthArray<std::vector<Point<float>,_std::allocator<Point<float>_>_>,_256LL>::QVarLengthArray
            (&this->graphPoints);
  QPainter::QPainter(&this->painter);
  this->lastTime = 0;
  iVar1 = InfoProvider::getGPUCount();
  QVarLengthArray<std::vector<Point<float>,_std::allocator<Point<float>_>_>,_256LL>::resize
            (&this->graphPoints,(long)iVar1);
  iVar1 = InfoProvider::getGPUCount();
  QVarLengthArray<UtilizationData,_256LL>::resize(&this->utilizationData,(long)iVar1);
  QWidget::setSizePolicy(&this->super_QWidget,Expanding,Expanding);
  QWidget::setMinimumHeight((ConnectionType)this);
  QObject::connect<void(UtilizationContainer::*)(),void(UtilizationWidget::*)()>
            ((Object *)local_38,(offset_in_UtilizationContainer_to_subr)local_18,
             (Object *)UtilizationContainer::onDataUpdated,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

UtilizationWidget::UtilizationWidget(UtilizationContainer *container) {
    graphPoints.resize(InfoProvider::getGPUCount());
    utilizationData.resize(InfoProvider::getGPUCount());

    setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
    setMinimumHeight(96);

    connect(container, &UtilizationContainer::onDataUpdated, this, &UtilizationWidget::onDataUpdated);
}